

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

string * testing::PrintToString<unsigned_short>
                   (string *__return_storage_ptr__,unsigned_short *value)

{
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  testing_internal::DefaultPrintNonContainerTo<unsigned_short>(value,local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}